

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialRuntimeObjects.cpp
# Opt level: O2

Oop __thiscall
Lodtalk::SpecialRuntimeObjects::makeSelector(SpecialRuntimeObjects *this,char *string)

{
  VMContext *this_00;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar1;
  allocator local_31;
  string local_30;
  
  this_00 = this->context;
  std::__cxx11::string::string((string *)&local_30,string,&local_31);
  aVar1 = (anon_union_8_4_0eb573b0_for_Oop_0)VMContext::makeSelector(this_00,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return (Oop)aVar1.pointer;
}

Assistant:

Oop SpecialRuntimeObjects::makeSelector(const char *string)
{
    return context->makeSelector(string);
}